

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConveyor.cpp
# Opt level: O1

void __thiscall chrono::ChConveyor::~ChConveyor(ChConveyor *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChConveyor_00b38768;
  if (this->internal_link != (ChLinkLockLock *)0x0) {
    (**(code **)((long)(this->internal_link->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.
                       super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj + 8))();
  }
  if (this->conveyor_plate != (ChBody *)0x0) {
    (*(this->conveyor_plate->super_ChPhysicsItem).super_ChObj._vptr_ChObj[1])();
  }
  if (this->conveyor_truss != (ChBody *)0x0) {
    (*(this->conveyor_truss->super_ChPhysicsItem).super_ChObj._vptr_ChObj[1])();
  }
  this_00 = (this->conveyor_mat).
            super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  ChPhysicsItem::~ChPhysicsItem(&this->super_ChPhysicsItem);
  return;
}

Assistant:

ChConveyor::~ChConveyor() {
    if (internal_link)
        delete internal_link;
    if (conveyor_plate)
        delete conveyor_plate;
    if (conveyor_truss)
        delete conveyor_truss;
}